

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O3

Mtbdd __thiscall sylvan::Mtbdd::Abstract(Mtbdd *this,BddSet *variables,mtbdd_abstract_op op)

{
  Task local_50;
  
  local_50.d._0_8_ = (variables->set).bdd;
  local_50.d._8_8_ = *(undefined8 *)op;
  local_50.f = mtbdd_abstract_WRAP;
  local_50.thief._M_b._M_p = (__base_type)(__pointer_type)0x1;
  lace_run_task(&local_50);
  this->mtbdd = local_50.d._0_8_;
  mtbdd_protect(&this->mtbdd);
  return (Mtbdd)(MTBDD)this;
}

Assistant:

Mtbdd
Mtbdd::Abstract(const BddSet &variables, mtbdd_abstract_op op) const
{
    return mtbdd_abstract(mtbdd, variables.set.bdd, op);
}